

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshSimplify.cpp
# Opt level: O0

Vec3d * __thiscall MeshSimplify::calVertexPos(MeshSimplify *this,Edge *e,Matrix *m)

{
  Vec3d *in_RCX;
  Vec3d *in_RDI;
  Vector4 ans;
  Solve *solve;
  Vector4 Y;
  Vec3d mid;
  Vec3d *in_stack_ffffffffffffff10;
  Vector4 *_v;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Solve *in_stack_ffffffffffffff40;
  double local_b8;
  double local_b0;
  double local_a8;
  Solve *in_stack_ffffffffffffff88;
  undefined1 local_50 [32];
  double local_30;
  double local_28;
  
  _v = (Vector4 *)local_50;
  operator+(in_RCX,in_stack_ffffffffffffff10);
  operator/(in_RCX,&in_stack_ffffffffffffff10->x);
  Vec3d::~Vec3d((Vec3d *)local_50);
  in_RCX[5].x = 0.0;
  in_RCX[5].y = 0.0;
  in_RCX[5].z = 0.0;
  in_RCX[6].x = 1.0;
  Vector4::Vector4((Vector4 *)&stack0xffffffffffffff70,0.0,0.0,0.0,1.0);
  operator_new(0xf0);
  Solve::Solve(in_stack_ffffffffffffff40,
               (Matrix *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),_v);
  Solve::getAns(in_stack_ffffffffffffff88);
  if (local_a8 <= 1e-08) {
    in_RDI->x = (double)local_50._24_8_;
    in_RDI->y = local_30;
    in_RDI->z = local_28;
  }
  else {
    Vec3d::Vec3d(in_RDI,(double)in_stack_ffffffffffffff40,local_b8,local_b0);
  }
  Vector4::~Vector4((Vector4 *)&stack0xffffffffffffff40);
  Vector4::~Vector4((Vector4 *)&stack0xffffffffffffff70);
  Vec3d::~Vec3d((Vec3d *)(local_50 + 0x18));
  return in_RDI;
}

Assistant:

Vec3d MeshSimplify::calVertexPos(Edge& e,Matrix m){
	Vec3d mid = (vGroup->group[e.v1].pos + vGroup->group[e.v2].pos) / 2;
	m.mat[3][0] = 0;
	m.mat[3][1] = 0;
	m.mat[3][2] = 0;
	m.mat[3][3] = 1;
	
	Vector4 Y(0,0,0,1);
	Solve* solve = new Solve(m,Y);
	Vector4 ans = solve->getAns();
	if(ans.v[3] > Config::EPS)
		return Vec3d(ans.v[0],ans.v[1],ans.v[2]);
	else
		return mid;
}